

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationDataBuilder::CollationDataBuilder(CollationDataBuilder *this,UErrorCode *errorCode)

{
  Normalizer2Impl *pNVar1;
  UErrorCode *errorCode_local;
  CollationDataBuilder *this_local;
  
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__CollationDataBuilder_004f11d8;
  pNVar1 = Normalizer2Factory::getNFCImpl(errorCode);
  this->nfcImpl = pNVar1;
  this->base = (CollationData *)0x0;
  this->baseSettings = (CollationSettings *)0x0;
  this->trie = (UTrie2 *)0x0;
  UVector32::UVector32(&this->ce32s,errorCode);
  UVector64::UVector64(&this->ce64s,errorCode);
  UVector::UVector(&this->conditionalCE32s,errorCode);
  UnicodeSet::UnicodeSet(&this->contextChars);
  UnicodeString::UnicodeString(&this->contexts);
  UnicodeSet::UnicodeSet(&this->unsafeBackwardSet);
  this->modified = '\0';
  this->fastLatinEnabled = '\0';
  this->fastLatinBuilder = (CollationFastLatinBuilder *)0x0;
  this->collIter = (DataBuilderCollationIterator *)0x0;
  UVector32::addElement(&this->ce32s,0,errorCode);
  UVector::setDeleter(&this->conditionalCE32s,uprv_deleteConditionalCE32_63);
  return;
}

Assistant:

CollationDataBuilder::CollationDataBuilder(UErrorCode &errorCode)
        : nfcImpl(*Normalizer2Factory::getNFCImpl(errorCode)),
          base(NULL), baseSettings(NULL),
          trie(NULL),
          ce32s(errorCode), ce64s(errorCode), conditionalCE32s(errorCode),
          modified(FALSE),
          fastLatinEnabled(FALSE), fastLatinBuilder(NULL),
          collIter(NULL) {
    // Reserve the first CE32 for U+0000.
    ce32s.addElement(0, errorCode);
    conditionalCE32s.setDeleter(uprv_deleteConditionalCE32);
}